

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O3

void instruct_br(Proc *proc,Pseudo *pseudo,uint line_number)

{
  C_MemoryAllocator *pCVar1;
  _Bool _Var2;
  BasicBlock *bb_to_start;
  undefined1 *ptr;
  
  if (((undefined1  [48])*pseudo & (undefined1  [48])0xf) != (undefined1  [48])0xa) {
    __assert_fail("pseudo->type == PSEUDO_BLOCK",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/linearizer.c"
                  ,0x399,"void instruct_br(Proc *, Pseudo *, unsigned int)");
  }
  _Var2 = is_block_terminated(proc->current_bb);
  if (_Var2) {
    bb_to_start = create_block(proc);
    start_block(proc,bb_to_start,line_number);
  }
  pCVar1 = proc->linearizer->compiler_state->allocator;
  ptr = (undefined1 *)(*pCVar1->calloc)(pCVar1->arena,1,0x28);
  *ptr = 0x49;
  *(uint *)(ptr + 0x20) = line_number;
  if (((undefined1  [48])*pseudo & (undefined1  [48])0xf) != (undefined1  [48])0xe) {
    raviX_ptrlist_add((PtrList **)(ptr + 0x10),pseudo,proc->linearizer->compiler_state->allocator);
    if (*(BasicBlock **)(ptr + 0x18) == proc->current_bb ||
        *(BasicBlock **)(ptr + 0x18) == (BasicBlock *)0x0) {
      raviX_ptrlist_add((PtrList **)&proc->current_bb->insns,ptr,
                        proc->linearizer->compiler_state->allocator);
      *(BasicBlock **)(ptr + 0x18) = proc->current_bb;
      return;
    }
    __assert_fail("insn->block == NULL || insn->block == proc->current_bb",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/linearizer.c"
                  ,0x1b1,"void add_instruction(Proc *, Instruction *)");
  }
  __assert_fail("pseudo->type != PSEUDO_INDEXED",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/linearizer.c"
                ,0x193,"void add_instruction_target(Proc *, Instruction *, Pseudo *)");
}

Assistant:

static void instruct_br(Proc *proc, Pseudo *pseudo, unsigned line_number)
{
	assert(pseudo->type == PSEUDO_BLOCK);
	if (is_block_terminated(proc->current_bb)) {
		start_block(proc, create_block(proc), line_number);
	}
	Instruction *insn = allocate_instruction(proc, op_br, line_number);
	add_instruction_target(proc, insn, pseudo);
	add_instruction(proc, insn);
}